

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matcher.cpp
# Opt level: O3

bool Kernel::MatchingUtils::haveReversedVariantArgs(Term *l1,Term *l2)

{
  int *piVar1;
  long *plVar2;
  uint uVar3;
  VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_> VVar4;
  IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_> IVar5;
  char cVar6;
  int iVar7;
  uint uVar8;
  DisagreementSetIterator *this;
  DisagreementSetIterator *this_00;
  VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_> this_01;
  CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>
  *extraout_RDX;
  CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>
  *extraout_RDX_00;
  CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>
  *extraout_RDX_01;
  CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>
  *i;
  IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>
  *i_00;
  CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>_>_>
  *extraout_RDX_02;
  CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>_>_>
  *extraout_RDX_03;
  CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>_>_>
  *extraout_RDX_04;
  CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>_>_>
  *i_01;
  uint uVar9;
  TermList t2;
  bool bVar10;
  undefined1 auVar11 [16];
  VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_> dsit;
  uint left;
  IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>
  it1;
  uint right;
  long *local_108;
  uint local_100 [2];
  DisagreementSetIterator *local_f8;
  DisagreementSetIterator *local_f0;
  IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *local_e8;
  IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *local_e0;
  TermList local_d8;
  IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>
  local_d0;
  IterTraits<Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>_>
  local_b8;
  undefined1 local_a0;
  DisagreementSetIterator *local_98;
  IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *local_90;
  undefined1 local_88;
  DisagreementSetIterator *local_80;
  IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *local_78;
  undefined1 local_70;
  DisagreementSetIterator *local_68;
  IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *local_60;
  IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>,_Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>_>_>_>_>_>_>
  local_58;
  
  if (haveReversedVariantArgs(Kernel::Term*,Kernel::Term*)::leftToRight == '\0') {
    haveReversedVariantArgs();
  }
  if (haveReversedVariantArgs(Kernel::Term*,Kernel::Term*)::rightToLeft == '\0') {
    haveReversedVariantArgs();
  }
  Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::reset
            (&haveReversedVariantArgs::leftToRight);
  Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::reset
            (&haveReversedVariantArgs::rightToLeft);
  t2._content = 2;
  if (((l1->_args[0]._content & 0x10) == 0) || (-1 < *(int *)&l1->field_0xc)) {
    bVar10 = false;
    local_d8._content = 2;
  }
  else {
    if (((l2->_args[0]._content & 0x10) == 0) || (-1 < *(int *)&l2->field_0xc)) {
      return false;
    }
    local_d8 = SortHelper::getEqualityArgumentSort((Literal *)l1);
    t2 = SortHelper::getEqualityArgumentSort((Literal *)l2);
    bVar10 = true;
  }
  this = (DisagreementSetIterator *)::operator_new(0x48);
  DisagreementSetIterator::DisagreementSetIterator
            (this,(TermList)l1->_args[*(uint *)&l1->field_0xc & 0xfffffff]._content,
             (TermList)l2->_args[(ulong)(*(uint *)&l2->field_0xc & 0xfffffff) - 1]._content,true);
  piVar1 = &(this->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt;
  *piVar1 = *piVar1 + 1;
  this_00 = (DisagreementSetIterator *)::operator_new(0x48);
  DisagreementSetIterator::DisagreementSetIterator
            (this_00,(TermList)l1->_args[(ulong)(*(uint *)&l1->field_0xc & 0xfffffff) - 1]._content,
             (TermList)l2->_args[*(uint *)&l2->field_0xc & 0xfffffff]._content,true);
  piVar1 = &(this->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt;
  *piVar1 = *piVar1 + 1;
  iVar7 = (this_00->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt + 4;
  (this_00->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt = iVar7;
  i = extraout_RDX;
  if (iVar7 == 0) {
    (*(this_00->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>).
      _vptr_IteratorCore[1])(this_00);
    iVar7 = (this_00->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt;
    i = extraout_RDX_00;
  }
  (this_00->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt = iVar7 + -1
  ;
  if (iVar7 + -1 == 0) {
    (*(this_00->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>).
      _vptr_IteratorCore[1])(this_00);
    iVar7 = (this_00->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt +
            1;
    i = extraout_RDX_01;
  }
  piVar1 = &(this->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt;
  *piVar1 = *piVar1 + 1;
  local_100[0] = CONCAT31(local_100[0]._1_3_,1);
  (this_00->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt = iVar7;
  local_f8 = this;
  local_f0 = this_00;
  Lib::
  iterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,Kernel::TermList>>,Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,Kernel::TermList>>>>>
            (&local_d0,(Lib *)local_100,i);
  if (local_f0 != (DisagreementSetIterator *)0x0) {
    piVar1 = &(local_f0->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt
    ;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*(local_f0->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>).
        _vptr_IteratorCore[1])();
    }
  }
  if (local_f8 != (DisagreementSetIterator *)0x0) {
    piVar1 = &(local_f8->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt
    ;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*(local_f8->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>).
        _vptr_IteratorCore[1])();
    }
  }
  iVar7 = (this_00->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt + -1
  ;
  (this_00->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt = iVar7;
  if (iVar7 == 0) {
    (*(this_00->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>).
      _vptr_IteratorCore[1])(this_00);
    iVar7 = (this_00->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt;
  }
  (this_00->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt = iVar7 + -1
  ;
  if (iVar7 + -1 == 0) {
    (*(this_00->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>).
      _vptr_IteratorCore[1])(this_00);
  }
  piVar1 = &(this->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    (*(this->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._vptr_IteratorCore
      [1])(this);
  }
  piVar1 = &(this_00->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    (*(this_00->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>).
      _vptr_IteratorCore[1])(this_00);
  }
  piVar1 = &(this->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    (*(this->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._vptr_IteratorCore
      [1])(this);
  }
  IVar5._iter._core =
       (VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>)
       (VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>)local_d0._iter._it2;
  this_01._core = local_d0._iter._it1._core;
  if (bVar10) {
    this_01._core =
         (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)::operator_new(0x48);
    DisagreementSetIterator::DisagreementSetIterator
              ((DisagreementSetIterator *)this_01._core,local_d8,t2,true);
    IVar5._iter._core =
         (VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>)
         (VirtualIterator<std::pair<Kernel::TermList,_Kernel::TermList>_>)local_d0._iter._it2;
    VVar4._core = local_d0._iter._it1._core;
    piVar1 = &(((DisagreementSetIterator *)this_01._core)->
              super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt;
    *piVar1 = *piVar1 + 1;
    local_88 = local_d0._iter._first;
    local_80 = (DisagreementSetIterator *)local_d0._iter._it1._core;
    if ((DisagreementSetIterator *)local_d0._iter._it1._core != (DisagreementSetIterator *)0x0) {
      (local_d0._iter._it1._core)->_refCnt = (local_d0._iter._it1._core)->_refCnt + 1;
    }
    local_78 = (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)
               local_d0._iter._it2._iter._core;
    if (local_d0._iter._it2._iter._core !=
        (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)0x0) {
      *(int *)((long)local_d0._iter._it2._iter._core + 8) =
           *(int *)((long)local_d0._iter._it2._iter._core + 8) + 1;
    }
    piVar1 = &(((DisagreementSetIterator *)this_01._core)->
              super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt;
    *piVar1 = *piVar1 + 1;
    local_70 = local_d0._iter._first;
    local_68 = (DisagreementSetIterator *)local_d0._iter._it1._core;
    if ((DisagreementSetIterator *)local_d0._iter._it1._core != (DisagreementSetIterator *)0x0) {
      (local_d0._iter._it1._core)->_refCnt = (local_d0._iter._it1._core)->_refCnt + 1;
    }
    local_60 = (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)
               local_d0._iter._it2._iter._core;
    if (local_d0._iter._it2._iter._core !=
        (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)0x0) {
      *(int *)((long)local_d0._iter._it2._iter._core + 8) =
           *(int *)((long)local_d0._iter._it2._iter._core + 8) + 1;
    }
    local_100[0] = CONCAT31(local_100[0]._1_3_,local_d0._iter._first);
    local_f8 = (DisagreementSetIterator *)local_d0._iter._it1._core;
    if ((DisagreementSetIterator *)local_d0._iter._it1._core != (DisagreementSetIterator *)0x0) {
      (local_d0._iter._it1._core)->_refCnt = (local_d0._iter._it1._core)->_refCnt + 1;
    }
    local_f0 = (DisagreementSetIterator *)local_d0._iter._it2._iter._core;
    if (local_d0._iter._it2._iter._core !=
        (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)0x0) {
      *(int *)((long)local_d0._iter._it2._iter._core + 8) =
           *(int *)((long)local_d0._iter._it2._iter._core + 8) + 1;
    }
    Lib::
    iterTraits<Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,Kernel::TermList>>,Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,Kernel::TermList>>>>>>
              (&local_b8,(Lib *)local_100,i_00);
    i_01 = extraout_RDX_02;
    if (local_f0 != (DisagreementSetIterator *)0x0) {
      piVar1 = (int *)((long)local_f0 + 8);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*(local_f0->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>).
          _vptr_IteratorCore[1])();
        i_01 = extraout_RDX_03;
      }
    }
    if (local_f8 != (DisagreementSetIterator *)0x0) {
      piVar1 = &(local_f8->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>).
                _refCnt;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*(local_f8->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>).
          _vptr_IteratorCore[1])();
        i_01 = extraout_RDX_04;
      }
    }
    local_100[0] = CONCAT31(local_100[0]._1_3_,1);
    piVar1 = &(((DisagreementSetIterator *)this_01._core)->
              super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt;
    *piVar1 = *piVar1 + 1;
    local_f0 = (DisagreementSetIterator *)CONCAT71(local_f0._1_7_,local_b8._iter._iter._first);
    local_e8 = local_b8._iter._iter._it1._core;
    if (local_b8._iter._iter._it1._core !=
        (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)0x0) {
      (local_b8._iter._iter._it1._core)->_refCnt = (local_b8._iter._iter._it1._core)->_refCnt + 1;
    }
    local_e0 = (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)
               local_b8._iter._iter._it2._iter._core;
    if (local_b8._iter._iter._it2._iter._core !=
        (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)0x0) {
      *(int *)((long)local_b8._iter._iter._it2._iter._core + 8) =
           *(int *)((long)local_b8._iter._iter._it2._iter._core + 8) + 1;
    }
    local_f8 = (DisagreementSetIterator *)this_01._core;
    Lib::
    iterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,Kernel::TermList>>,Lib::IterTraits<Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,Kernel::TermList>>,Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,Kernel::TermList>>>>>>>>
              (&local_58,(Lib *)local_100,i_01);
    if (local_e0 != (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)0x0) {
      piVar1 = &local_e0->_refCnt;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*local_e0->_vptr_IteratorCore[1])();
      }
    }
    if (local_e8 != (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)0x0) {
      piVar1 = &local_e8->_refCnt;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*local_e8->_vptr_IteratorCore[1])();
      }
    }
    if (local_f8 != (DisagreementSetIterator *)0x0) {
      piVar1 = &(local_f8->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>).
                _refCnt;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*(local_f8->super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>).
          _vptr_IteratorCore[1])();
      }
    }
    if (local_b8._iter._iter._it2._iter._core !=
        (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)0x0) {
      piVar1 = (int *)((long)local_b8._iter._iter._it2._iter._core + 8);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*(*(_func_int ***)local_b8._iter._iter._it2._iter._core)[1])();
      }
    }
    if (local_b8._iter._iter._it1._core !=
        (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)0x0) {
      piVar1 = &(local_b8._iter._iter._it1._core)->_refCnt;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*(local_b8._iter._iter._it1._core)->_vptr_IteratorCore[1])();
      }
    }
    if (IVar5._iter._core != (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)0x0) {
      piVar1 = (int *)((long)IVar5._iter._core + 8);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*(*(_func_int ***)IVar5._iter._core)[1])(IVar5._iter._core);
      }
    }
    if ((DisagreementSetIterator *)VVar4._core != (DisagreementSetIterator *)0x0) {
      piVar1 = &(VVar4._core)->_refCnt;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*((IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)
          &(VVar4._core)->_vptr_IteratorCore)->_vptr_IteratorCore[1])(VVar4._core);
      }
    }
    piVar1 = &(((DisagreementSetIterator *)this_01._core)->
              super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._refCnt;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*(((DisagreementSetIterator *)this_01._core)->
        super_IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_>)._vptr_IteratorCore[1])
                (this_01._core);
    }
    Lib::
    pvi<Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,Kernel::TermList>>,Lib::IterTraits<Lib::IterTraits<Lib::CatIterator<Lib::VirtualIterator<std::pair<Kernel::TermList,Kernel::TermList>>,Lib::IterTraits<Lib::VirtualIterator<std::pair<Kernel::TermList,Kernel::TermList>>>>>>>>>
              ((Lib *)&local_108,&local_58);
    if (local_58._iter._it2._iter._iter._it2._iter._core !=
        (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)0x0) {
      piVar1 = (int *)((long)local_58._iter._it2._iter._iter._it2._iter._core + 8);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (**(code **)(*(long *)local_58._iter._it2._iter._iter._it2._iter._core + 8))();
      }
    }
    if (local_58._iter._it2._iter._iter._it1._core !=
        (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)0x0) {
      piVar1 = &(local_58._iter._it2._iter._iter._it1._core)->_refCnt;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*(local_58._iter._it2._iter._iter._it1._core)->_vptr_IteratorCore[1])();
      }
    }
    if (local_58._iter._it1._core !=
        (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)0x0) {
      piVar1 = &(local_58._iter._it1._core)->_refCnt;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*(local_58._iter._it1._core)->_vptr_IteratorCore[1])();
      }
    }
    if (IVar5._iter._core != (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)0x0) {
      piVar1 = (int *)((long)IVar5._iter._core + 8);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*(*(_func_int ***)IVar5._iter._core)[1])(IVar5._iter._core);
      }
    }
    if ((DisagreementSetIterator *)VVar4._core != (DisagreementSetIterator *)0x0) {
      piVar1 = &(VVar4._core)->_refCnt;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*((IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)
          &(VVar4._core)->_vptr_IteratorCore)->_vptr_IteratorCore[1])(VVar4._core);
      }
    }
  }
  else {
    local_a0 = local_d0._iter._first;
    local_98 = (DisagreementSetIterator *)local_d0._iter._it1._core;
    if ((DisagreementSetIterator *)local_d0._iter._it1._core != (DisagreementSetIterator *)0x0) {
      (local_d0._iter._it1._core)->_refCnt = (local_d0._iter._it1._core)->_refCnt + 1;
    }
    local_90 = (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)
               local_d0._iter._it2._iter._core;
    if (local_d0._iter._it2._iter._core !=
        (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)0x0) {
      *(int *)((long)local_d0._iter._it2._iter._core + 8) =
           *(int *)((long)local_d0._iter._it2._iter._core + 8) + 1;
    }
    local_108 = (long *)Lib::FixedSizeAllocator<48UL>::alloc
                                  ((FixedSizeAllocator<48UL> *)
                                   (Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    if ((DisagreementSetIterator *)this_01._core != (DisagreementSetIterator *)0x0) {
      (this_01._core)->_refCnt = (this_01._core)->_refCnt + 1;
    }
    if (IVar5._iter._core != (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)0x0) {
      *(int *)((long)IVar5._iter._core + 8) = *(int *)((long)IVar5._iter._core + 8) + 1;
    }
    *(undefined4 *)(local_108 + 1) = 0;
    *local_108 = (long)&PTR__ProxyIterator_00b3ce80;
    *(bool *)(local_108 + 2) = local_d0._iter._first;
    local_108[3] = (long)this_01._core;
    if ((DisagreementSetIterator *)this_01._core != (DisagreementSetIterator *)0x0) {
      (this_01._core)->_refCnt = (this_01._core)->_refCnt + 1;
    }
    local_108[4] = (long)IVar5._iter._core;
    if (IVar5._iter._core == (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)0x0) {
      *(int *)(local_108 + 1) = (int)local_108[1] + 1;
    }
    else {
      *(int *)((long)IVar5._iter._core + 8) = *(int *)((long)IVar5._iter._core + 8) + 1;
      *(int *)(local_108 + 1) = (int)local_108[1] + 1;
      piVar1 = (int *)((long)IVar5._iter._core + 8);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*(*(_func_int ***)IVar5._iter._core)[1])(IVar5._iter._core);
      }
    }
    if ((DisagreementSetIterator *)this_01._core != (DisagreementSetIterator *)0x0) {
      piVar1 = &(this_01._core)->_refCnt;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*((IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)
          &(this_01._core)->_vptr_IteratorCore)->_vptr_IteratorCore[1])(this_01._core);
      }
    }
    if (IVar5._iter._core != (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)0x0) {
      piVar1 = (int *)((long)IVar5._iter._core + 8);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*(*(_func_int ***)IVar5._iter._core)[1])(IVar5._iter._core);
      }
    }
    if ((DisagreementSetIterator *)this_01._core == (DisagreementSetIterator *)0x0)
    goto LAB_005589cc;
  }
  piVar1 = &((IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)
            &(this_01._core)->_vptr_IteratorCore)->_refCnt;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    (*((IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)
      &(this_01._core)->_vptr_IteratorCore)->_vptr_IteratorCore[1])(this_01._core);
  }
LAB_005589cc:
  do {
    cVar6 = (**(code **)(*local_108 + 0x10))();
    if (cVar6 == '\0') {
      bVar10 = haveReversedVariantArgs::leftToRight._size ==
               haveReversedVariantArgs::rightToLeft._size;
      goto LAB_00558a5b;
    }
    auVar11 = (**(code **)(*local_108 + 0x18))();
    bVar10 = false;
    if (((auVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
       (bVar10 = false, (auVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0))
    goto LAB_00558a5b;
    local_100[0] = (uint)(auVar11._0_8_ >> 2);
    uVar9 = (uint)(auVar11._8_8_ >> 2);
    local_b8._iter._iter._0_4_ = uVar9;
    uVar8 = Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::
            findOrInsert(&haveReversedVariantArgs::leftToRight,local_100[0],(uint *)&local_b8);
    uVar3 = local_100[0];
  } while ((uVar8 == uVar9) &&
          (uVar8 = Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::
                   findOrInsert(&haveReversedVariantArgs::rightToLeft,local_b8._iter._iter._0_4_,
                                local_100), uVar3 == uVar8));
  bVar10 = false;
LAB_00558a5b:
  if (local_108 != (long *)0x0) {
    plVar2 = local_108 + 1;
    *(int *)plVar2 = (int)*plVar2 + -1;
    if ((int)*plVar2 == 0) {
      (**(code **)(*local_108 + 8))();
    }
  }
  if (local_d0._iter._it2._iter._core !=
      (IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)0x0) {
    piVar1 = (int *)((long)local_d0._iter._it2._iter._core + 8);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*(*(_func_int ***)local_d0._iter._it2._iter._core)[1])();
    }
  }
  if ((DisagreementSetIterator *)local_d0._iter._it1._core != (DisagreementSetIterator *)0x0) {
    piVar1 = &(local_d0._iter._it1._core)->_refCnt;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*((IteratorCore<std::pair<Kernel::TermList,_Kernel::TermList>_> *)
        &(local_d0._iter._it1._core)->_vptr_IteratorCore)->_vptr_IteratorCore[1])();
    }
  }
  return bVar10;
}

Assistant:

bool MatchingUtils::haveReversedVariantArgs(Term* l1, Term* l2)
{
  ASS_EQ(l1->arity(), 2);
  ASS_EQ(l2->arity(), 2);

  static DHMap<unsigned,unsigned,IdentityHash,DefaultHash> leftToRight;
  static DHMap<unsigned,unsigned,IdentityHash,DefaultHash> rightToLeft;
  leftToRight.reset();
  rightToLeft.reset();

  TermList s1, s2;
  bool sortUsed = false;
  if(l1->isLiteral() && static_cast<Literal*>(l1)->isTwoVarEquality())
  {
    if(l2->isLiteral() && static_cast<Literal*>(l2)->isTwoVarEquality()){
       s1 = SortHelper::getEqualityArgumentSort(static_cast<Literal*>(l1));
       s2 = SortHelper::getEqualityArgumentSort(static_cast<Literal*>(l2));
       sortUsed = true;
    } else {
      return false;
    }
  }

  auto it1 = concatIters(
      vi( new DisagreementSetIterator(*l1->nthArgument(0),*l2->nthArgument(1)) ),
      vi( new DisagreementSetIterator(*l1->nthArgument(1),*l2->nthArgument(0)) ));

  VirtualIterator<pair<TermList, TermList> > dsit =
  sortUsed ? pvi(concatIters(vi(new DisagreementSetIterator(s1,s2)), it1)) :
             pvi(it1);

  while(dsit.hasNext()) {
    pair<TermList,TermList> dp=dsit.next(); //disagreement pair
    if(!dp.first.isVar() || !dp.second.isVar()) {
  return false;
    }
    unsigned left=dp.first.var();
    unsigned right=dp.second.var();
    if(right!=leftToRight.findOrInsert(left,right)) {
  return false;
    }
    if(left!=rightToLeft.findOrInsert(right,left)) {
  return false;
    }
  }
  if(leftToRight.size()!=rightToLeft.size()) {
    return false;
  }

  return true;
}